

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::Postprocess_BuildMesh
          (X3DImporter *this,CX3DImporter_NodeElement *pNodeElement,aiMesh **pMesh)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  size_t *psVar2;
  int iVar3;
  long lVar4;
  aiMesh *paVar5;
  DeadlyImportError *pDVar6;
  _List_node_base *p_Var7;
  long *plVar8;
  CX3DImporter_NodeElement *pCVar9;
  _List_node_base *p_Var10;
  CX3DImporter_NodeElement_Geometry2D *tnemesh;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar11;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tarr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  size_type *local_38;
  
  if (pMesh == (aiMesh **)0x0) {
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&tarr,"Postprocess_BuildMesh. pMesh is nullptr.",(allocator *)&local_78);
    DeadlyImportError::DeadlyImportError(pDVar6,(string *)&tarr);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*pMesh != (aiMesh *)0x0) {
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&tarr,"Postprocess_BuildMesh. *pMesh must be nullptr.",
               (allocator *)&local_78);
    DeadlyImportError::DeadlyImportError(pDVar6,(string *)&tarr);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  switch(pNodeElement->Type) {
  case ENET_Arc2D:
  case ENET_ArcClose2D:
  case ENET_Circle2D:
  case ENET_Disk2D:
  case ENET_Polyline2D:
  case ENET_Polypoint2D:
  case ENET_Rectangle2D:
  case ENET_TriangleSet2D:
    tarr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tarr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    tarr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (&tarr,(size_type)pNodeElement[1].ID._M_dataplus._M_p);
    pCVar9 = pNodeElement + 1;
    while (pCVar9 = (CX3DImporter_NodeElement *)pCVar9->_vptr_CX3DImporter_NodeElement,
          pCVar9 != pNodeElement + 1) {
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (&tarr,(value_type *)&pCVar9->ID);
    }
    paVar5 = StandardShapes::MakeMesh(&tarr,(uint)pNodeElement[1].ID._M_string_length);
    goto LAB_0054a81b;
  case ENET_Box:
  case ENET_Cone:
  case ENET_Cylinder:
  case ENET_Sphere:
    tarr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tarr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    tarr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (&tarr,(size_type)pNodeElement[1].ID._M_dataplus._M_p);
    pCVar9 = pNodeElement + 1;
    while (pCVar9 = (CX3DImporter_NodeElement *)pCVar9->_vptr_CX3DImporter_NodeElement,
          pCVar9 != pNodeElement + 1) {
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (&tarr,(value_type *)&pCVar9->ID);
    }
    paVar5 = StandardShapes::MakeMesh(&tarr,(uint)pNodeElement[1].ID._M_string_length);
LAB_0054a81b:
    *pMesh = paVar5;
    std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
              (&tarr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
    break;
  case ENET_ElevationGrid:
    paVar5 = GeometryHelper_MakeMesh
                       (this,(vector<int,_std::allocator<int>_> *)
                             ((long)&pNodeElement[1].ID.field_2 + 8),
                        (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        (pNodeElement + 1));
    *pMesh = paVar5;
    p_Var7 = (_List_node_base *)&pNodeElement->Child;
    while (p_Var7 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var7 != (_List_node_base *)&pNodeElement->Child) {
      lVar4 = (long)p_Var7[1]._M_next;
      iVar3 = *(int *)(lVar4 + 8);
      if (iVar3 == 0x16) {
        MeshGeometry_AddNormal
                  (this,*pMesh,
                   (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(lVar4 + 0x50),
                   (bool)pNodeElement[1].ID.field_2._M_local_buf[1]);
      }
      else if (iVar3 == 0x17) {
        MeshGeometry_AddTexCoord
                  (this,*pMesh,
                   (list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)(lVar4 + 0x50));
      }
      else if (iVar3 == 0x23) {
        MeshGeometry_AddColor
                  (this,*pMesh,
                   (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(lVar4 + 0x50),
                   (bool)pNodeElement[1].ID.field_2._M_local_buf[2]);
      }
      else {
        if (iVar3 != 0x22) {
          pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          to_string<CX3DImporter_NodeElement::EType>
                    (&local_58,*(EType *)((long)p_Var7[1]._M_next + 8));
          std::operator+(&local_78,"Postprocess_BuildMesh. Unknown child of ElevationGrid: ",
                         &local_58);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tarr,
                         &local_78,".");
          DeadlyImportError::DeadlyImportError(pDVar6,(string *)&tarr);
          __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        MeshGeometry_AddColor
                  (this,*pMesh,(list<aiColor3D,_std::allocator<aiColor3D>_> *)(lVar4 + 0x50),
                   (bool)pNodeElement[1].ID.field_2._M_local_buf[2]);
      }
    }
    break;
  case ENET_Extrusion:
    paVar5 = GeometryHelper_MakeMesh
                       (this,(vector<int,_std::allocator<int>_> *)
                             &pNodeElement[1].Child.
                              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                              ._M_impl._M_node._M_size,
                        (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        (pNodeElement + 1));
    *pMesh = paVar5;
    break;
  default:
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    to_string<CX3DImporter_NodeElement::EType>(&local_58,pNodeElement->Type);
    std::operator+(&local_78,"Postprocess_BuildMesh. Unknown mesh type: ",&local_58);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tarr,
                   &local_78,".");
    DeadlyImportError::DeadlyImportError(pDVar6,(string *)&tarr);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  case ENET_IndexedFaceSet:
    plVar11 = &pNodeElement->Child;
    psVar2 = &pNodeElement[1].Child.
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    p_Var7 = (_List_node_base *)plVar11;
    while (p_Var7 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var7 != (_List_node_base *)plVar11) {
      if (*(int *)((long)p_Var7[1]._M_next + 8) == 0x15) {
        paVar5 = GeometryHelper_MakeMesh
                           (this,(vector<int,_std::allocator<int>_> *)psVar2,
                            (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            ((long)p_Var7[1]._M_next + 0x50));
        *pMesh = paVar5;
      }
    }
    local_38 = &pNodeElement[2].ID._M_string_length;
    pvVar1 = (vector<int,_std::allocator<int>_> *)((long)&pNodeElement[1].ID.field_2 + 8);
    p_Var7 = (_List_node_base *)plVar11;
    while (p_Var7 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var7 != (_List_node_base *)plVar11) {
      lVar4 = (long)p_Var7[1]._M_next;
      iVar3 = *(int *)(lVar4 + 8);
      if (iVar3 != 0x15) {
        if (iVar3 == 0x16) {
          MeshGeometry_AddNormal
                    (this,*pMesh,(vector<int,_std::allocator<int>_> *)psVar2,
                     (vector<int,_std::allocator<int>_> *)local_38,
                     (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(lVar4 + 0x50),
                     *(bool *)&pNodeElement[2].Parent);
        }
        else if (iVar3 == 0x17) {
          MeshGeometry_AddTexCoord
                    (this,*pMesh,(vector<int,_std::allocator<int>_> *)psVar2,
                     (vector<int,_std::allocator<int>_> *)&pNodeElement[2].Child,
                     (list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)(lVar4 + 0x50))
          ;
        }
        else if (iVar3 == 0x23) {
          MeshGeometry_AddColor
                    (this,*pMesh,(vector<int,_std::allocator<int>_> *)psVar2,pvVar1,
                     (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(lVar4 + 0x50),
                     *(bool *)&pNodeElement[1].Child.
                               super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                               ._M_impl._M_node.super__List_node_base._M_prev);
        }
        else {
          if (iVar3 != 0x22) {
            pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            to_string<CX3DImporter_NodeElement::EType>
                      (&local_58,*(EType *)((long)p_Var7[1]._M_next + 8));
            std::operator+(&local_78,"Postprocess_BuildMesh. Unknown child of IndexedFaceSet: ",
                           &local_58);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &tarr,&local_78,".");
            DeadlyImportError::DeadlyImportError(pDVar6,(string *)&tarr);
            __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          MeshGeometry_AddColor
                    (this,*pMesh,(vector<int,_std::allocator<int>_> *)psVar2,pvVar1,
                     (list<aiColor3D,_std::allocator<aiColor3D>_> *)(lVar4 + 0x50),
                     *(bool *)&pNodeElement[1].Child.
                               super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                               ._M_impl._M_node.super__List_node_base._M_prev);
        }
      }
    }
    break;
  case ENET_IndexedLineSet:
    plVar11 = &pNodeElement->Child;
    psVar2 = &pNodeElement[1].Child.
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    p_Var7 = (_List_node_base *)plVar11;
    while (p_Var7 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var7 != (_List_node_base *)plVar11) {
      if (*(int *)((long)p_Var7[1]._M_next + 8) == 0x15) {
        paVar5 = GeometryHelper_MakeMesh
                           (this,(vector<int,_std::allocator<int>_> *)psVar2,
                            (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            ((long)p_Var7[1]._M_next + 0x50));
        *pMesh = paVar5;
      }
    }
    pvVar1 = (vector<int,_std::allocator<int>_> *)((long)&pNodeElement[1].ID.field_2 + 8);
    p_Var7 = (_List_node_base *)plVar11;
    while (p_Var7 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var7 != (_List_node_base *)plVar11) {
      paVar5 = *pMesh;
      if (paVar5 == (aiMesh *)0x0) {
        __assert_fail("*pMesh",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/X3D/X3DImporter_Postprocess.cpp"
                      ,0x16a,
                      "void Assimp::X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement &, aiMesh **) const"
                     );
      }
      lVar4 = (long)p_Var7[1]._M_next;
      iVar3 = *(int *)(lVar4 + 8);
      if (iVar3 != 0x15) {
        if (iVar3 == 0x23) {
          MeshGeometry_AddColor
                    (this,paVar5,(vector<int,_std::allocator<int>_> *)psVar2,pvVar1,
                     (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(lVar4 + 0x50),
                     *(bool *)&pNodeElement[1].Child.
                               super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                               ._M_impl._M_node.super__List_node_base._M_prev);
        }
        else {
          if (iVar3 != 0x22) {
            pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            to_string<CX3DImporter_NodeElement::EType>
                      (&local_58,*(EType *)((long)p_Var7[1]._M_next + 8));
            std::operator+(&local_78,"Postprocess_BuildMesh. Unknown child of IndexedLineSet: ",
                           &local_58);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &tarr,&local_78,".");
            DeadlyImportError::DeadlyImportError(pDVar6,(string *)&tarr);
            __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          MeshGeometry_AddColor
                    (this,paVar5,(vector<int,_std::allocator<int>_> *)psVar2,pvVar1,
                     (list<aiColor3D,_std::allocator<aiColor3D>_> *)(lVar4 + 0x50),
                     *(bool *)&pNodeElement[1].Child.
                               super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                               ._M_impl._M_node.super__List_node_base._M_prev);
        }
      }
    }
    break;
  case ENET_IndexedTriangleSet:
  case ENET_IndexedTriangleFanSet:
  case ENET_IndexedTriangleStripSet:
    plVar11 = &pNodeElement->Child;
    psVar2 = &pNodeElement[1].Child.
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    p_Var7 = (_List_node_base *)plVar11;
    while (p_Var7 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var7 != (_List_node_base *)plVar11) {
      if (*(int *)((long)p_Var7[1]._M_next + 8) == 0x15) {
        paVar5 = GeometryHelper_MakeMesh
                           (this,(vector<int,_std::allocator<int>_> *)psVar2,
                            (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            ((long)p_Var7[1]._M_next + 0x50));
        *pMesh = paVar5;
      }
    }
    local_38 = &pNodeElement[2].ID._M_string_length;
    pvVar1 = (vector<int,_std::allocator<int>_> *)((long)&pNodeElement[1].ID.field_2 + 8);
    p_Var7 = (_List_node_base *)plVar11;
    while (p_Var7 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var7 != (_List_node_base *)plVar11) {
      paVar5 = *pMesh;
      if (paVar5 == (aiMesh *)0x0) {
        __assert_fail("*pMesh",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/X3D/X3DImporter_Postprocess.cpp"
                      ,0x18b,
                      "void Assimp::X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement &, aiMesh **) const"
                     );
      }
      lVar4 = (long)p_Var7[1]._M_next;
      iVar3 = *(int *)(lVar4 + 8);
      if (iVar3 != 0x15) {
        if (iVar3 == 0x16) {
          MeshGeometry_AddNormal
                    (this,paVar5,(vector<int,_std::allocator<int>_> *)psVar2,
                     (vector<int,_std::allocator<int>_> *)local_38,
                     (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(lVar4 + 0x50),
                     *(bool *)&pNodeElement[2].Parent);
        }
        else if (iVar3 == 0x17) {
          MeshGeometry_AddTexCoord
                    (this,paVar5,(vector<int,_std::allocator<int>_> *)psVar2,
                     (vector<int,_std::allocator<int>_> *)&pNodeElement[2].Child,
                     (list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)(lVar4 + 0x50))
          ;
        }
        else if (iVar3 == 0x23) {
          MeshGeometry_AddColor
                    (this,paVar5,(vector<int,_std::allocator<int>_> *)psVar2,pvVar1,
                     (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(lVar4 + 0x50),
                     *(bool *)&pNodeElement[1].Child.
                               super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                               ._M_impl._M_node.super__List_node_base._M_prev);
        }
        else {
          if (iVar3 != 0x22) {
            pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            to_string<CX3DImporter_NodeElement::EType>
                      (&local_58,*(EType *)((long)p_Var7[1]._M_next + 8));
            std::operator+(&local_78,
                           "Postprocess_BuildMesh. Unknown child of IndexedTriangleSet or IndexedTriangleFanSet, or \t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\tIndexedTriangleStripSet: "
                           ,&local_58);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &tarr,&local_78,".");
            DeadlyImportError::DeadlyImportError(pDVar6,(string *)&tarr);
            __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          MeshGeometry_AddColor
                    (this,paVar5,(vector<int,_std::allocator<int>_> *)psVar2,pvVar1,
                     (list<aiColor3D,_std::allocator<aiColor3D>_> *)(lVar4 + 0x50),
                     *(bool *)&pNodeElement[1].Child.
                               super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                               ._M_impl._M_node.super__List_node_base._M_prev);
        }
      }
    }
    break;
  case ENET_LineSet:
    plVar11 = &pNodeElement->Child;
    p_Var7 = (_List_node_base *)plVar11;
    while (p_Var7 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var10 = (_List_node_base *)plVar11, p_Var7 != (_List_node_base *)plVar11) {
      if (*(int *)((long)p_Var7[1]._M_next + 8) == 0x15) {
        paVar5 = GeometryHelper_MakeMesh
                           (this,(vector<int,_std::allocator<int>_> *)
                                 ((long)&pNodeElement[1].ID.field_2 + 8),
                            (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            ((long)p_Var7[1]._M_next + 0x50));
        *pMesh = paVar5;
      }
    }
    while (p_Var10 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                        *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var10 != (_List_node_base *)plVar11) {
      paVar5 = *pMesh;
      if (paVar5 == (aiMesh *)0x0) {
        __assert_fail("*pMesh",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/X3D/X3DImporter_Postprocess.cpp"
                      ,0x1e3,
                      "void Assimp::X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement &, aiMesh **) const"
                     );
      }
      lVar4 = (long)p_Var10[1]._M_next;
      iVar3 = *(int *)(lVar4 + 8);
      if (iVar3 != 0x15) {
        if (iVar3 == 0x23) {
          MeshGeometry_AddColor
                    (this,paVar5,
                     (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(lVar4 + 0x50),
                     true);
        }
        else {
          if (iVar3 != 0x22) {
            pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            to_string<CX3DImporter_NodeElement::EType>
                      (&local_58,*(EType *)((long)p_Var10[1]._M_next + 8));
            std::operator+(&local_78,"Postprocess_BuildMesh. Unknown child of LineSet: ",&local_58);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &tarr,&local_78,".");
            DeadlyImportError::DeadlyImportError(pDVar6,(string *)&tarr);
            __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          MeshGeometry_AddColor
                    (this,paVar5,(list<aiColor3D,_std::allocator<aiColor3D>_> *)(lVar4 + 0x50),true)
          ;
        }
      }
    }
    break;
  case ENET_PointSet:
    plVar11 = &pNodeElement->Child;
    p_Var7 = (_List_node_base *)plVar11;
    while (p_Var7 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var10 = (_List_node_base *)plVar11, p_Var7 != (_List_node_base *)plVar11) {
      if (*(int *)((long)p_Var7[1]._M_next + 8) == 0x15) {
        tarr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tarr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        tarr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                   &tarr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,
                   *(size_type *)((long)p_Var7[1]._M_next + 0x60));
        plVar8 = (long *)((long)p_Var7[1]._M_next + 0x50);
        while (plVar8 = (long *)*plVar8, plVar8 != (long *)((long)p_Var7[1]._M_next + 0x50)) {
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     &tarr.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,
                     (value_type *)(plVar8 + 2));
        }
        paVar5 = StandardShapes::MakeMesh
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            &tarr.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ,1);
        *pMesh = paVar5;
        std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                  (&tarr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
        ;
      }
    }
    while (p_Var10 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                        *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var10 != (_List_node_base *)plVar11) {
      paVar5 = *pMesh;
      if (paVar5 == (aiMesh *)0x0) {
        __assert_fail("*pMesh",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/X3D/X3DImporter_Postprocess.cpp"
                      ,0x1c5,
                      "void Assimp::X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement &, aiMesh **) const"
                     );
      }
      lVar4 = (long)p_Var10[1]._M_next;
      iVar3 = *(int *)(lVar4 + 8);
      if (iVar3 != 0x15) {
        if (iVar3 == 0x23) {
          MeshGeometry_AddColor
                    (this,paVar5,
                     (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(lVar4 + 0x50),
                     true);
        }
        else {
          if (iVar3 != 0x22) {
            pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            to_string<CX3DImporter_NodeElement::EType>
                      (&local_58,*(EType *)((long)p_Var10[1]._M_next + 8));
            std::operator+(&local_78,"Postprocess_BuildMesh. Unknown child of PointSet: ",&local_58)
            ;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &tarr,&local_78,".");
            DeadlyImportError::DeadlyImportError(pDVar6,(string *)&tarr);
            __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          MeshGeometry_AddColor
                    (this,paVar5,(list<aiColor3D,_std::allocator<aiColor3D>_> *)(lVar4 + 0x50),true)
          ;
        }
      }
    }
    break;
  case ENET_TriangleSet:
    plVar11 = &pNodeElement->Child;
    p_Var7 = (_List_node_base *)plVar11;
    while (p_Var7 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var7 != (_List_node_base *)plVar11) {
      if (*(int *)((long)p_Var7[1]._M_next + 8) == 0x15) {
        tarr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tarr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        tarr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                   &tarr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,
                   *(size_type *)((long)p_Var7[1]._M_next + 0x60));
        plVar8 = (long *)((long)p_Var7[1]._M_next + 0x50);
        while (plVar8 = (long *)*plVar8, plVar8 != (long *)((long)p_Var7[1]._M_next + 0x50)) {
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     &tarr.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,
                     (value_type *)(plVar8 + 2));
        }
        paVar5 = StandardShapes::MakeMesh
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            &tarr.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ,3);
        *pMesh = paVar5;
        std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                  (&tarr.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
        ;
      }
    }
    pvVar1 = (vector<int,_std::allocator<int>_> *)((long)&pNodeElement[1].ID.field_2 + 8);
    p_Var7 = (_List_node_base *)plVar11;
    while (p_Var7 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var7 != (_List_node_base *)plVar11) {
      paVar5 = *pMesh;
      if (paVar5 == (aiMesh *)0x0) {
        __assert_fail("*pMesh",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/X3D/X3DImporter_Postprocess.cpp"
                      ,0x22f,
                      "void Assimp::X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement &, aiMesh **) const"
                     );
      }
      lVar4 = (long)p_Var7[1]._M_next;
      iVar3 = *(int *)(lVar4 + 8);
      if (iVar3 != 0x15) {
        if (iVar3 == 0x16) {
          MeshGeometry_AddNormal
                    (this,paVar5,pvVar1,
                     (vector<int,_std::allocator<int>_> *)
                     &pNodeElement[1].Child.
                      super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                      ._M_impl._M_node.super__List_node_base._M_prev,
                     (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(lVar4 + 0x50),
                     (bool)pNodeElement[1].ID.field_2._M_local_buf[3]);
        }
        else if (iVar3 == 0x17) {
          MeshGeometry_AddTexCoord
                    (this,paVar5,pvVar1,(vector<int,_std::allocator<int>_> *)&pNodeElement[2].Type,
                     (list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)(lVar4 + 0x50))
          ;
        }
        else if (iVar3 == 0x23) {
          MeshGeometry_AddColor
                    (this,paVar5,
                     (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(lVar4 + 0x50),
                     (bool)pNodeElement[1].ID.field_2._M_local_buf[2]);
        }
        else {
          if (iVar3 != 0x22) {
            pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            to_string<CX3DImporter_NodeElement::EType>
                      (&local_58,*(EType *)((long)p_Var7[1]._M_next + 8));
            std::operator+(&local_78,"Postprocess_BuildMesh. Unknown child of TrianlgeSet: ",
                           &local_58);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &tarr,&local_78,".");
            DeadlyImportError::DeadlyImportError(pDVar6,(string *)&tarr);
            __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          MeshGeometry_AddColor
                    (this,paVar5,(list<aiColor3D,_std::allocator<aiColor3D>_> *)(lVar4 + 0x50),
                     (bool)pNodeElement[1].ID.field_2._M_local_buf[2]);
        }
      }
    }
    break;
  case ENET_TriangleFanSet:
    plVar11 = &pNodeElement->Child;
    pvVar1 = (vector<int,_std::allocator<int>_> *)
             (&pNodeElement[1].ID.field_2._M_allocated_capacity + 1);
    p_Var7 = (_List_node_base *)plVar11;
    while (p_Var7 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var7 != (_List_node_base *)plVar11) {
      if (*(int *)((long)p_Var7[1]._M_next + 8) == 0x15) {
        paVar5 = GeometryHelper_MakeMesh
                           (this,pvVar1,
                            (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            ((long)p_Var7[1]._M_next + 0x50));
        *pMesh = paVar5;
      }
    }
    p_Var7 = (_List_node_base *)plVar11;
    while ((p_Var7 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                        *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
           p_Var7 != (_List_node_base *)plVar11 && (paVar5 = *pMesh, paVar5 != (aiMesh *)0x0))) {
      lVar4 = (long)p_Var7[1]._M_next;
      iVar3 = *(int *)(lVar4 + 8);
      if (iVar3 != 0x15) {
        if (iVar3 == 0x16) {
          MeshGeometry_AddNormal
                    (this,paVar5,pvVar1,
                     (vector<int,_std::allocator<int>_> *)
                     &pNodeElement[1].Child.
                      super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                      ._M_impl._M_node.super__List_node_base._M_prev,
                     (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(lVar4 + 0x50),
                     (bool)pNodeElement[1].ID.field_2._M_local_buf[3]);
        }
        else if (iVar3 == 0x17) {
          MeshGeometry_AddTexCoord
                    (this,paVar5,pvVar1,(vector<int,_std::allocator<int>_> *)&pNodeElement[2].Type,
                     (list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)(lVar4 + 0x50))
          ;
        }
        else if (iVar3 == 0x23) {
          MeshGeometry_AddColor
                    (this,paVar5,
                     (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(lVar4 + 0x50),
                     (bool)pNodeElement[1].ID.field_2._M_local_buf[2]);
        }
        else {
          if (iVar3 != 0x22) {
            pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            to_string<CX3DImporter_NodeElement::EType>
                      (&local_58,*(EType *)((long)p_Var7[1]._M_next + 8));
            std::operator+(&local_78,"Postprocess_BuildMesh. Unknown child of TrianlgeFanSet: ",
                           &local_58);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &tarr,&local_78,".");
            DeadlyImportError::DeadlyImportError(pDVar6,(string *)&tarr);
            __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          MeshGeometry_AddColor
                    (this,paVar5,(list<aiColor3D,_std::allocator<aiColor3D>_> *)(lVar4 + 0x50),
                     (bool)pNodeElement[1].ID.field_2._M_local_buf[2]);
        }
      }
    }
    break;
  case ENET_TriangleStripSet:
    plVar11 = &pNodeElement->Child;
    pvVar1 = (vector<int,_std::allocator<int>_> *)
             (&pNodeElement[1].ID.field_2._M_allocated_capacity + 1);
    p_Var7 = (_List_node_base *)plVar11;
    while (p_Var7 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var7 != (_List_node_base *)plVar11) {
      if (*(int *)((long)p_Var7[1]._M_next + 8) == 0x15) {
        paVar5 = GeometryHelper_MakeMesh
                           (this,pvVar1,
                            (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            ((long)p_Var7[1]._M_next + 0x50));
        *pMesh = paVar5;
      }
    }
    p_Var7 = (_List_node_base *)plVar11;
    while (p_Var7 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var7 != (_List_node_base *)plVar11) {
      paVar5 = *pMesh;
      if (paVar5 == (aiMesh *)0x0) {
        __assert_fail("*pMesh",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/X3D/X3DImporter_Postprocess.cpp"
                      ,0x252,
                      "void Assimp::X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement &, aiMesh **) const"
                     );
      }
      lVar4 = (long)p_Var7[1]._M_next;
      iVar3 = *(int *)(lVar4 + 8);
      if (iVar3 != 0x15) {
        if (iVar3 == 0x16) {
          MeshGeometry_AddNormal
                    (this,paVar5,pvVar1,
                     (vector<int,_std::allocator<int>_> *)
                     &pNodeElement[1].Child.
                      super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                      ._M_impl._M_node.super__List_node_base._M_prev,
                     (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(lVar4 + 0x50),
                     (bool)pNodeElement[1].ID.field_2._M_local_buf[3]);
        }
        else if (iVar3 == 0x17) {
          MeshGeometry_AddTexCoord
                    (this,paVar5,pvVar1,(vector<int,_std::allocator<int>_> *)&pNodeElement[2].Type,
                     (list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)(lVar4 + 0x50))
          ;
        }
        else if (iVar3 == 0x23) {
          MeshGeometry_AddColor
                    (this,paVar5,
                     (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(lVar4 + 0x50),
                     (bool)pNodeElement[1].ID.field_2._M_local_buf[2]);
        }
        else {
          if (iVar3 != 0x22) {
            pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            to_string<CX3DImporter_NodeElement::EType>
                      (&local_58,*(EType *)((long)p_Var7[1]._M_next + 8));
            std::operator+(&local_78,"Postprocess_BuildMesh. Unknown child of TriangleStripSet: ",
                           &local_58);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &tarr,&local_78,".");
            DeadlyImportError::DeadlyImportError(pDVar6,(string *)&tarr);
            __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          MeshGeometry_AddColor
                    (this,paVar5,(list<aiColor3D,_std::allocator<aiColor3D>_> *)(lVar4 + 0x50),
                     (bool)pNodeElement[1].ID.field_2._M_local_buf[2]);
        }
      }
    }
  }
  return;
}

Assistant:

void X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement& pNodeElement, aiMesh** pMesh) const
{
	// check argument
	if(pMesh == nullptr) throw DeadlyImportError("Postprocess_BuildMesh. pMesh is nullptr.");
	if(*pMesh != nullptr) throw DeadlyImportError("Postprocess_BuildMesh. *pMesh must be nullptr.");

	/************************************************************************************************************************************/
	/************************************************************ Geometry2D ************************************************************/
	/************************************************************************************************************************************/
	if((pNodeElement.Type == CX3DImporter_NodeElement::ENET_Arc2D) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_ArcClose2D) ||
		(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Circle2D) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_Disk2D) ||
		(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Polyline2D) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_Polypoint2D) ||
		(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Rectangle2D) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleSet2D))
	{
		CX3DImporter_NodeElement_Geometry2D& tnemesh = *((CX3DImporter_NodeElement_Geometry2D*)&pNodeElement);// create alias for convenience
		std::vector<aiVector3D> tarr;

		tarr.reserve(tnemesh.Vertices.size());
		for(std::list<aiVector3D>::iterator it = tnemesh.Vertices.begin(); it != tnemesh.Vertices.end(); ++it) tarr.push_back(*it);
		*pMesh = StandardShapes::MakeMesh(tarr, static_cast<unsigned int>(tnemesh.NumIndices));// create mesh from vertices using Assimp help.

		return;// mesh is build, nothing to do anymore.
	}
	/************************************************************************************************************************************/
	/************************************************************ Geometry3D ************************************************************/
	/************************************************************************************************************************************/
	//
	// Predefined figures
	//
	if((pNodeElement.Type == CX3DImporter_NodeElement::ENET_Box) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_Cone) ||
		(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Cylinder) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_Sphere))
	{
		CX3DImporter_NodeElement_Geometry3D& tnemesh = *((CX3DImporter_NodeElement_Geometry3D*)&pNodeElement);// create alias for convenience
		std::vector<aiVector3D> tarr;

		tarr.reserve(tnemesh.Vertices.size());
		for(std::list<aiVector3D>::iterator it = tnemesh.Vertices.begin(); it != tnemesh.Vertices.end(); ++it) tarr.push_back(*it);

		*pMesh = StandardShapes::MakeMesh(tarr, static_cast<unsigned int>(tnemesh.NumIndices));// create mesh from vertices using Assimp help.

		return;// mesh is build, nothing to do anymore.
	}
	//
	// Parametric figures
	//
	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_ElevationGrid)
	{
		CX3DImporter_NodeElement_ElevationGrid& tnemesh = *((CX3DImporter_NodeElement_ElevationGrid*)&pNodeElement);// create alias for convenience

		// at first create mesh from existing vertices.
		*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIdx, tnemesh.Vertices);
		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Normal)
				MeshGeometry_AddNormal(**pMesh,  ((CX3DImporter_NodeElement_Normal*)*ch_it)->Value, tnemesh.NormalPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_TextureCoordinate)
				MeshGeometry_AddTexCoord(**pMesh, ((CX3DImporter_NodeElement_TextureCoordinate*)*ch_it)->Value);
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of ElevationGrid: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_ElevationGrid)
	//
	// Indexed primitives sets
	//
	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedFaceSet)
	{
		CX3DImporter_NodeElement_IndexedSet& tnemesh = *((CX3DImporter_NodeElement_IndexedSet*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, tnemesh.CoordIndex, tnemesh.ColorIndex, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, tnemesh.CoordIndex, tnemesh.ColorIndex, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value,
										tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Normal)
				MeshGeometry_AddNormal(**pMesh, tnemesh.CoordIndex, tnemesh.NormalIndex, ((CX3DImporter_NodeElement_Normal*)*ch_it)->Value,
										tnemesh.NormalPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_TextureCoordinate)
				MeshGeometry_AddTexCoord(**pMesh, tnemesh.CoordIndex, tnemesh.TexCoordIndex, ((CX3DImporter_NodeElement_TextureCoordinate*)*ch_it)->Value);
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of IndexedFaceSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedFaceSet)

	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedLineSet)
	{
		CX3DImporter_NodeElement_IndexedSet& tnemesh = *((CX3DImporter_NodeElement_IndexedSet*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			ai_assert(*pMesh);
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, tnemesh.CoordIndex, tnemesh.ColorIndex, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, tnemesh.CoordIndex, tnemesh.ColorIndex, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value,
										tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of IndexedLineSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedLineSet)

	if((pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedTriangleSet) ||
		(pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedTriangleFanSet) ||
		(pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedTriangleStripSet))
	{
		CX3DImporter_NodeElement_IndexedSet& tnemesh = *((CX3DImporter_NodeElement_IndexedSet*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			ai_assert(*pMesh);
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, tnemesh.CoordIndex, tnemesh.ColorIndex, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, tnemesh.CoordIndex, tnemesh.ColorIndex, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value,
										tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Normal)
				MeshGeometry_AddNormal(**pMesh, tnemesh.CoordIndex, tnemesh.NormalIndex, ((CX3DImporter_NodeElement_Normal*)*ch_it)->Value,
										tnemesh.NormalPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_TextureCoordinate)
				MeshGeometry_AddTexCoord(**pMesh, tnemesh.CoordIndex, tnemesh.TexCoordIndex, ((CX3DImporter_NodeElement_TextureCoordinate*)*ch_it)->Value);
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of IndexedTriangleSet or IndexedTriangleFanSet, or \
																	IndexedTriangleStripSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if((pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedTriangleFanSet) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedTriangleStripSet))

	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Extrusion)
	{
		CX3DImporter_NodeElement_IndexedSet& tnemesh = *((CX3DImporter_NodeElement_IndexedSet*)&pNodeElement);// create alias for convenience

		*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, tnemesh.Vertices);

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Extrusion)

	//
	// Primitives sets
	//
	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_PointSet)
	{
		CX3DImporter_NodeElement_Set& tnemesh = *((CX3DImporter_NodeElement_Set*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				std::vector<aiVector3D> vec_copy;

				vec_copy.reserve(((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value.size());
				for(std::list<aiVector3D>::const_iterator it = ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value.begin();
					it != ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value.end(); ++it)
				{
					vec_copy.push_back(*it);
				}

				*pMesh = StandardShapes::MakeMesh(vec_copy, 1);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			ai_assert(*pMesh);
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, true);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value, true);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of PointSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_PointSet)

	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_LineSet)
	{
		CX3DImporter_NodeElement_Set& tnemesh = *((CX3DImporter_NodeElement_Set*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			ai_assert(*pMesh);
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, true);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value, true);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of LineSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_LineSet)

	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleFanSet)
	{
		CX3DImporter_NodeElement_Set& tnemesh = *((CX3DImporter_NodeElement_Set*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if ( nullptr == *pMesh ) {
				break;
			}
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value,tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Normal)
				MeshGeometry_AddNormal(**pMesh, tnemesh.CoordIndex, tnemesh.NormalIndex, ((CX3DImporter_NodeElement_Normal*)*ch_it)->Value,
										tnemesh.NormalPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_TextureCoordinate)
				MeshGeometry_AddTexCoord(**pMesh, tnemesh.CoordIndex, tnemesh.TexCoordIndex, ((CX3DImporter_NodeElement_TextureCoordinate*)*ch_it)->Value);
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of TrianlgeFanSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleFanSet)

	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleSet)
	{
		CX3DImporter_NodeElement_Set& tnemesh = *((CX3DImporter_NodeElement_Set*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				std::vector<aiVector3D> vec_copy;

				vec_copy.reserve(((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value.size());
				for(std::list<aiVector3D>::const_iterator it = ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value.begin();
					it != ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value.end(); ++it)
				{
					vec_copy.push_back(*it);
				}

				*pMesh = StandardShapes::MakeMesh(vec_copy, 3);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			ai_assert(*pMesh);
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Normal)
				MeshGeometry_AddNormal(**pMesh, tnemesh.CoordIndex, tnemesh.NormalIndex, ((CX3DImporter_NodeElement_Normal*)*ch_it)->Value,
										tnemesh.NormalPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_TextureCoordinate)
				MeshGeometry_AddTexCoord(**pMesh, tnemesh.CoordIndex, tnemesh.TexCoordIndex, ((CX3DImporter_NodeElement_TextureCoordinate*)*ch_it)->Value);
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of TrianlgeSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleSet)

	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleStripSet)
	{
		CX3DImporter_NodeElement_Set& tnemesh = *((CX3DImporter_NodeElement_Set*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			ai_assert(*pMesh);
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Normal)
				MeshGeometry_AddNormal(**pMesh, tnemesh.CoordIndex, tnemesh.NormalIndex, ((CX3DImporter_NodeElement_Normal*)*ch_it)->Value,
										tnemesh.NormalPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_TextureCoordinate)
				MeshGeometry_AddTexCoord(**pMesh, tnemesh.CoordIndex, tnemesh.TexCoordIndex, ((CX3DImporter_NodeElement_TextureCoordinate*)*ch_it)->Value);
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of TriangleStripSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleStripSet)

	throw DeadlyImportError("Postprocess_BuildMesh. Unknown mesh type: " + to_string(pNodeElement.Type) + ".");
}